

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

float * stbi__hdr_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  stbi_uc *psVar1;
  stbi_uc *psVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  stbi_uc sVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  float *output;
  byte *pbVar10;
  stbi_uc *psVar11;
  uint uVar12;
  long lVar13;
  byte bVar14;
  uint c;
  int iVar15;
  stbi_uc *psVar16;
  uint a;
  int *piVar17;
  stbi_uc sVar18;
  float *output_00;
  undefined1 auVar19 [16];
  stbi_uc rgbe [4];
  stbi_uc rgbe_1 [4];
  char buffer [1024];
  int *local_4a0;
  stbi_uc *local_498;
  ulong local_490;
  float *local_488;
  stbi_uc *local_480;
  ulong local_478;
  long local_470;
  ulong local_468;
  ulong local_460;
  long local_458;
  ulong local_450;
  long local_448;
  stbi_uc local_440;
  stbi_uc local_43f;
  byte local_43e;
  stbi_uc local_43d;
  stbi_uc local_43c [4];
  undefined1 local_438 [3];
  int iStack_435;
  undefined4 uStack_431;
  undefined5 uStack_42d;
  undefined7 uStack_428;
  
  iVar15 = req_comp;
  stbi__hdr_gettoken(s,local_438);
  if ((CONCAT44(uStack_431,iStack_435) == 0x45434e41494441 &&
       CONCAT17((undefined1)uStack_431,
                CONCAT43(iStack_435,CONCAT12(local_438[2],CONCAT11(local_438[1],local_438[0])))) ==
       0x4e41494441523f23) ||
     (iStack_435 == 0x454247 &&
      CONCAT13((undefined1)iStack_435,CONCAT12(local_438[2],CONCAT11(local_438[1],local_438[0]))) ==
      0x47523f23)) {
    stbi__hdr_gettoken(s,local_438);
    if (local_438[0] != '\0') {
      local_490 = CONCAT44(local_490._4_4_,req_comp);
      bVar4 = false;
      do {
        auVar19[1] = local_438[1];
        auVar19[0] = local_438[0];
        auVar19[2] = local_438[2];
        auVar19._3_4_ = iStack_435;
        auVar19._7_4_ = uStack_431;
        auVar19._11_5_ = uStack_42d;
        auVar3._4_5_ = uStack_42d;
        auVar3._0_4_ = uStack_431;
        auVar3._9_7_ = uStack_428;
        auVar19 = vpternlogq_avx512vl(s_FORMAT_32_bit_rl32_bit_rle_rgbe_005765f0._0_16_ ^ auVar19,
                                      s_FORMAT_32_bit_rl32_bit_rle_rgbe_005765f0._16_16_,auVar3,0xf6
                                     );
        if (auVar19 == (undefined1  [16])0x0) {
          bVar4 = true;
        }
        stbi__hdr_gettoken(s,local_438);
      } while (local_438[0] != '\0');
      if (bVar4) {
        local_4a0 = (int *)local_438;
        stbi__hdr_gettoken(s,local_438);
        if (local_438[2] == ' ' && CONCAT11(local_438[1],local_438[0]) == 0x592d) {
          local_4a0 = &iStack_435;
          uVar8 = strtol((char *)local_4a0,(char **)&local_4a0,10);
          local_4a0 = (int *)((long)local_4a0 + -1);
          do {
            piVar17 = local_4a0;
            local_4a0 = (int *)((long)piVar17 + 1);
          } while (*(char *)((long)piVar17 + 1) == ' ');
          iVar6 = strncmp((char *)local_4a0,"+X ",3);
          if (iVar6 == 0) {
            local_4a0 = piVar17 + 1;
            uVar9 = strtol((char *)local_4a0,(char **)0x0,10);
            a = (uint)uVar9;
            *x = a;
            uVar7 = (uint)uVar8;
            *y = uVar7;
            if (comp != (int *)0x0) {
              *comp = 3;
            }
            c = 3;
            if ((uint)local_490 != 0) {
              c = (uint)local_490;
            }
            if (((int)(a | uVar7) < 0) ||
               ((((uVar7 != 0 && ((int)(0x7fffffff / (uVar8 & 0xffffffff)) < (int)a)) ||
                 (uVar12 = a * uVar7, (int)(uVar12 | c) < 0)) ||
                (((int)(0x7fffffff / (ulong)c) < (int)uVar12 || (0x1fffffff < uVar12 * c)))))) {
              stbi__g_failure_reason = "too large";
              return (float *)0x0;
            }
            local_490 = uVar8;
            output = (float *)stbi__malloc_mad4(a,uVar7,c,uVar12 * c,iVar15);
            if (output == (float *)0x0) {
LAB_00326582:
              stbi__g_failure_reason = "outofmem";
              return (float *)0x0;
            }
            iVar15 = 0;
            if (a - 0x8000 < 0xffff8008) goto LAB_00326590;
            if ((int)local_490 < 1) {
              psVar16 = (stbi_uc *)0x0;
            }
            else {
              psVar1 = s->buffer_start;
              psVar2 = s->buffer_start + 1;
              local_450 = (ulong)(a * 4);
              local_460 = local_490 & 0x7fffffff;
              local_468 = uVar9 & 0x7fffffff;
              local_458 = (uVar9 & 0xffffffff) * (long)(int)c * 4;
              local_448 = (long)(int)c << 2;
              local_478 = 0;
              psVar16 = (stbi_uc *)0x0;
              local_488 = output;
              do {
                psVar11 = s->img_buffer;
                if (psVar11 < s->img_buffer_end) {
LAB_0032604e:
                  s->img_buffer = psVar11 + 1;
                  sVar5 = *psVar11;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar15 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                    if (iVar15 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar1;
                      s->img_buffer_end = psVar2;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar1;
                      s->img_buffer_end = psVar1 + iVar15;
                    }
                    psVar11 = s->img_buffer;
                    goto LAB_0032604e;
                  }
                  sVar5 = '\0';
                }
                psVar11 = s->img_buffer;
                if (psVar11 < s->img_buffer_end) {
LAB_003260cc:
                  s->img_buffer = psVar11 + 1;
                  sVar18 = *psVar11;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar15 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                    if (iVar15 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar1;
                      s->img_buffer_end = psVar2;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar1;
                      s->img_buffer_end = psVar1 + iVar15;
                    }
                    psVar11 = s->img_buffer;
                    goto LAB_003260cc;
                  }
                  sVar18 = '\0';
                }
                pbVar10 = s->img_buffer;
                if (pbVar10 < s->img_buffer_end) {
LAB_0032614a:
                  s->img_buffer = pbVar10 + 1;
                  bVar14 = *pbVar10;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar15 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                    if (iVar15 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar1;
                      s->img_buffer_end = psVar2;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar1;
                      s->img_buffer_end = psVar1 + iVar15;
                    }
                    pbVar10 = s->img_buffer;
                    goto LAB_0032614a;
                  }
                  bVar14 = 0;
                }
                if (((sVar5 != '\x02') || (sVar18 != '\x02')) || ((char)bVar14 < '\0')) {
                  local_440 = sVar5;
                  local_43f = sVar18;
                  local_43e = bVar14;
                  local_43d = stbi__get8(s);
                  stbi__hdr_convert(output,&local_440,c);
                  free(psVar16);
                  iVar15 = 0;
                  iVar6 = 1;
                  do {
                    stbi__getn(s,local_43c,4);
                    stbi__hdr_convert(output + (long)(int)(c * a * iVar15) + (long)(int)(iVar6 * c),
                                      local_43c,c);
                    iVar6 = iVar6 + 1;
                    while ((int)a <= iVar6) {
                      iVar15 = iVar15 + 1;
LAB_00326590:
                      iVar6 = 0;
                      if ((int)(uint)local_490 <= iVar15) {
                        return output;
                      }
                    }
                  } while( true );
                }
                pbVar10 = s->img_buffer;
                if (pbVar10 < s->img_buffer_end) {
LAB_003261d9:
                  s->img_buffer = pbVar10 + 1;
                  uVar7 = (uint)*pbVar10;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar15 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                    if (iVar15 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar1;
                      s->img_buffer_end = psVar2;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar1;
                      s->img_buffer_end = psVar1 + iVar15;
                    }
                    pbVar10 = s->img_buffer;
                    goto LAB_003261d9;
                  }
                  uVar7 = 0;
                }
                if (((uint)bVar14 << 8 | uVar7) != a) {
                  free(output);
                  free(psVar16);
                  stbi__g_failure_reason = "invalid decoded scanline length";
                  return (float *)0x0;
                }
                if (psVar16 == (stbi_uc *)0x0) {
                  if ((int)a < 0x20000000) {
                    psVar16 = (stbi_uc *)malloc(local_450);
                  }
                  else {
                    psVar16 = (stbi_uc *)0x0;
                  }
                  if (psVar16 == (stbi_uc *)0x0) {
                    free(output);
                    goto LAB_00326582;
                  }
                }
                local_470 = 0;
                local_498 = psVar16;
                local_480 = psVar16;
                do {
                  if (0 < (int)a) {
                    iVar15 = 0;
                    uVar8 = uVar9 & 0xffffffff;
                    do {
                      pbVar10 = s->img_buffer;
                      if (pbVar10 < s->img_buffer_end) {
LAB_003262b6:
                        s->img_buffer = pbVar10 + 1;
                        uVar7 = (uint)*pbVar10;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          iVar6 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                          if (iVar6 == 0) {
                            s->read_from_callbacks = 0;
                            s->img_buffer = psVar1;
                            s->img_buffer_end = psVar2;
                            s->buffer_start[0] = '\0';
                          }
                          else {
                            s->img_buffer = psVar1;
                            s->img_buffer_end = psVar1 + iVar6;
                          }
                          pbVar10 = s->img_buffer;
                          goto LAB_003262b6;
                        }
                        uVar7 = 0;
                      }
                      psVar16 = local_480;
                      if ((byte)uVar7 < 0x81) {
                        if ((uint)uVar8 < uVar7) goto LAB_003264de;
                        if (uVar7 != 0) {
                          lVar13 = 0;
                          do {
                            psVar11 = s->img_buffer;
                            if (psVar11 < s->img_buffer_end) {
LAB_003263a2:
                              s->img_buffer = psVar11 + 1;
                              sVar5 = *psVar11;
                            }
                            else {
                              if (s->read_from_callbacks != 0) {
                                iVar6 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                                if (iVar6 == 0) {
                                  s->read_from_callbacks = 0;
                                  s->img_buffer = psVar1;
                                  s->img_buffer_end = psVar2;
                                  s->buffer_start[0] = '\0';
                                }
                                else {
                                  s->img_buffer = psVar1;
                                  s->img_buffer_end = psVar1 + iVar6;
                                }
                                psVar11 = s->img_buffer;
                                goto LAB_003263a2;
                              }
                              sVar5 = '\0';
                            }
                            psVar16[lVar13 * 4 + (long)iVar15 * 4] = sVar5;
                            lVar13 = lVar13 + 1;
                          } while (uVar7 != (uint)lVar13);
                          iVar15 = iVar15 + (uint)lVar13;
                        }
                      }
                      else {
                        psVar16 = s->img_buffer;
                        if (psVar16 < s->img_buffer_end) {
LAB_003263ee:
                          s->img_buffer = psVar16 + 1;
                          sVar5 = *psVar16;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            iVar6 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                            if (iVar6 == 0) {
                              s->read_from_callbacks = 0;
                              s->img_buffer = psVar1;
                              s->img_buffer_end = psVar2;
                              s->buffer_start[0] = '\0';
                            }
                            else {
                              s->img_buffer = psVar1;
                              s->img_buffer_end = psVar1 + iVar6;
                            }
                            psVar16 = s->img_buffer;
                            goto LAB_003263ee;
                          }
                          sVar5 = '\0';
                        }
                        if ((uint)uVar8 < (uVar7 & 0x7f)) {
LAB_003264de:
                          free(output);
                          free(local_498);
                          stbi__g_failure_reason = "corrupt";
                          return (float *)0x0;
                        }
                        if ((uVar7 & 0x7f) != 0) {
                          lVar13 = 0;
                          do {
                            local_480[lVar13 * 4 + (long)iVar15 * 4] = sVar5;
                            lVar13 = lVar13 + 1;
                          } while ((uVar7 & 0x7f) != (uint)lVar13);
                          iVar15 = iVar15 + (uint)lVar13;
                        }
                      }
                      uVar8 = (ulong)(a - iVar15);
                    } while (a - iVar15 != 0 && iVar15 <= (int)a);
                  }
                  local_470 = local_470 + 1;
                  local_480 = local_480 + 1;
                } while (local_470 != 4);
                local_470 = 4;
                psVar16 = local_498;
                uVar8 = local_468;
                output_00 = local_488;
                if (0 < (int)a) {
                  do {
                    stbi__hdr_convert(output_00,psVar16,c);
                    output_00 = (float *)((long)output_00 + local_448);
                    psVar16 = psVar16 + 4;
                    uVar8 = uVar8 - 1;
                  } while (uVar8 != 0);
                }
                local_478 = local_478 + 1;
                local_488 = (float *)((long)local_488 + local_458);
                psVar16 = local_498;
              } while (local_478 != local_460);
            }
            if (psVar16 != (stbi_uc *)0x0) {
              free(psVar16);
              return output;
            }
            return output;
          }
        }
        stbi__g_failure_reason = "unsupported data layout";
        return (float *)0x0;
      }
    }
    stbi__g_failure_reason = "unsupported format";
  }
  else {
    stbi__g_failure_reason = "not HDR";
  }
  return (float *)0x0;
}

Assistant:

static float *stbi__hdr_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   char buffer[STBI__HDR_BUFLEN];
   char *token;
   int valid = 0;
   int width, height;
   stbi_uc *scanline;
   float *hdr_data;
   int len;
   unsigned char count, value;
   int i, j, k, c1,c2, z;
   const char *headerToken;
   STBI_NOTUSED(ri);

   // Check identifier
   headerToken = stbi__hdr_gettoken(s,buffer);
   if (strcmp(headerToken, "#?RADIANCE") != 0 && strcmp(headerToken, "#?RGBE") != 0)
      return stbi__errpf("not HDR", "Corrupt HDR image");

   // Parse header
   for(;;) {
      token = stbi__hdr_gettoken(s,buffer);
      if (token[0] == 0) break;
      if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0) valid = 1;
   }

   if (!valid)    return stbi__errpf("unsupported format", "Unsupported HDR format");

   // Parse width and height
   // can't use sscanf() if we're not using stdio!
   token = stbi__hdr_gettoken(s,buffer);
   if (strncmp(token, "-Y ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   height = (int) strtol(token, &token, 10);
   while (*token == ' ') ++token;
   if (strncmp(token, "+X ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   width = (int) strtol(token, NULL, 10);

   *x = width;
   *y = height;

   if (comp) *comp = 3;
   if (req_comp == 0) req_comp = 3;

   if (!stbi__mad4sizes_valid(width, height, req_comp, sizeof(float), 0))
      return stbi__errpf("too large", "HDR image is too large");

   // Read data
   hdr_data = (float *) stbi__malloc_mad4(width, height, req_comp, sizeof(float), 0);
   if (!hdr_data)
      return stbi__errpf("outofmem", "Out of memory");

   // Load image data
   // image data is stored as some number of sca
   if ( width < 8 || width >= 32768) {
      // Read flat data
      for (j=0; j < height; ++j) {
         for (i=0; i < width; ++i) {
            stbi_uc rgbe[4];
           main_decode_loop:
            stbi__getn(s, rgbe, 4);
            stbi__hdr_convert(hdr_data + j * width * req_comp + i * req_comp, rgbe, req_comp);
         }
      }
   } else {
      // Read RLE-encoded data
      scanline = NULL;

      for (j = 0; j < height; ++j) {
         c1 = stbi__get8(s);
         c2 = stbi__get8(s);
         len = stbi__get8(s);
         if (c1 != 2 || c2 != 2 || (len & 0x80)) {
            // not run-length encoded, so we have to actually use THIS data as a decoded
            // pixel (note this can't be a valid pixel--one of RGB must be >= 128)
            stbi_uc rgbe[4];
            rgbe[0] = (stbi_uc) c1;
            rgbe[1] = (stbi_uc) c2;
            rgbe[2] = (stbi_uc) len;
            rgbe[3] = (stbi_uc) stbi__get8(s);
            stbi__hdr_convert(hdr_data, rgbe, req_comp);
            i = 1;
            j = 0;
            STBI_FREE(scanline);
            goto main_decode_loop; // yes, this makes no sense
         }
         len <<= 8;
         len |= stbi__get8(s);
         if (len != width) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("invalid decoded scanline length", "corrupt HDR"); }
         if (scanline == NULL) {
            scanline = (stbi_uc *) stbi__malloc_mad2(width, 4, 0);
            if (!scanline) {
               STBI_FREE(hdr_data);
               return stbi__errpf("outofmem", "Out of memory");
            }
         }

         for (k = 0; k < 4; ++k) {
            int nleft;
            i = 0;
            while ((nleft = width - i) > 0) {
               count = stbi__get8(s);
               if (count > 128) {
                  // Run
                  value = stbi__get8(s);
                  count -= 128;
                  if (count > nleft) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("corrupt", "bad RLE data in HDR"); }
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = value;
               } else {
                  // Dump
                  if (count > nleft) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("corrupt", "bad RLE data in HDR"); }
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = stbi__get8(s);
               }
            }
         }
         for (i=0; i < width; ++i)
            stbi__hdr_convert(hdr_data+(j*width + i)*req_comp, scanline + i*4, req_comp);
      }
      if (scanline)
         STBI_FREE(scanline);
   }

   return hdr_data;
}